

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.h
# Opt level: O0

CrashReason *
google::glog_internal_namespace_::
sync_val_compare_and_swap<google::glog_internal_namespace_::CrashReason_const*>
          (CrashReason **ptr,CrashReason *oldval,CrashReason *newval)

{
  CrashReason *pCVar1;
  CrashReason *newval_local;
  CrashReason *oldval_local;
  CrashReason **ptr_local;
  
  LOCK();
  pCVar1 = *ptr;
  if (oldval == pCVar1) {
    *ptr = newval;
    pCVar1 = oldval;
  }
  UNLOCK();
  return pCVar1;
}

Assistant:

inline T sync_val_compare_and_swap(T* ptr, T oldval, T newval) {
#if defined(HAVE___SYNC_VAL_COMPARE_AND_SWAP)
  return __sync_val_compare_and_swap(ptr, oldval, newval);
#elif defined(__GNUC__) && (defined(__i386__) || defined(__x86_64__))
  T ret;
  __asm__ __volatile__("lock; cmpxchg %1, (%2);"
                       :"=a"(ret)
                        // GCC may produces %sil or %dil for
                        // constraint "r", but some of apple's gas
                        // dosn't know the 8 bit registers.
                        // We use "q" to avoid these registers.
                       :"q"(newval), "q"(ptr), "a"(oldval)
                       :"memory", "cc");
  return ret;
#else
  T ret = *ptr;
  if (ret == oldval) {
    *ptr = newval;
  }
  return ret;
#endif
}